

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genmbcs.cpp
# Opt level: O1

UBool MBCSAddFromUnicode(MBCSData *mbcsData,uint8_t *bytes,int32_t length,UChar32 c,int8_t flag)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *pcVar7;
  sbyte sVar8;
  byte bVar9;
  uint uVar10;
  char cVar11;
  byte *pbVar12;
  byte *pbVar13;
  char cVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  undefined7 in_register_00000081;
  int iVar18;
  uint uVar19;
  uint32_t uVar20;
  char buffer [10];
  char local_4e [10];
  undefined4 local_44;
  uint8_t *local_40;
  UChar32 local_34;
  
  uVar3 = (mbcsData->ucm->states).maxCharLength;
  if ((((mbcsData->ucm->states).outputType == '\f') && (IGNORE_SISO_CHECK == '\0')) &&
     ((*bytes & 0xfe) == 0xe)) {
    MBCSAddFromUnicode();
    return '\0';
  }
  if ((length == 1 && flag == '\x01') && (*bytes == '\0')) {
    fprintf(_stderr,"error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",(ulong)(uint)c,0
           );
    return '\0';
  }
  uVar4 = c >> 10;
  cVar11 = mbcsData->utf8Friendly;
  if ((cVar11 == '\0') || (uVar19 = 0x3c, (int)(uint)mbcsData->utf8Max < c)) {
    uVar19 = 0x3f;
  }
  local_40 = mbcsData->fromUBytes;
  uVar19 = (uint)c >> 4 & uVar19;
  if (mbcsData->stage1[uVar4] == 0) {
    uVar5 = mbcsData->stage2Top;
    uVar6 = (ulong)uVar5;
    if (cVar11 != '\0') {
      uVar17 = uVar5 - uVar19;
      uVar15 = uVar17;
      if (uVar5 < uVar17) {
        uVar15 = uVar5;
      }
      uVar10 = uVar5 + 1;
      do {
        uVar5 = uVar15;
        if (uVar6 <= uVar17) break;
        uVar10 = uVar10 - 1;
        lVar16 = uVar6 - 1;
        uVar6 = uVar6 - 1;
        uVar5 = uVar10;
      } while (mbcsData->stage2[lVar16] == 0);
    }
    if (0xfbc0 < uVar5 + 0x40) {
      MBCSAddFromUnicode();
      return '\0';
    }
    if (uVar5 < 0xffffffc0) {
      mbcsData->stage1[uVar4] = (uint16_t)uVar5;
    }
    mbcsData->stage2Top = uVar5 + 0x40;
  }
  uVar19 = uVar19 + mbcsData->stage1[uVar4];
  local_44 = (undefined4)CONCAT71(in_register_00000081,flag);
  if ((cVar11 == '\0') || ((int)(uint)mbcsData->utf8Max < c)) {
    uVar4 = 0xf;
    sVar8 = 4;
  }
  else {
    uVar4 = 0x3f;
    sVar8 = 6;
  }
  uVar4 = uVar4 & c;
  if (mbcsData->stage2[uVar19] == 0) {
    uVar20 = mbcsData->stage3Top;
    if (0xf < uVar4 && cVar11 != '\0') {
      uVar5 = (uVar4 & 0xfffffff0) * uVar3;
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        lVar16 = 0;
        do {
          if (local_40[(uVar20 - 1) + (int)lVar16] != '\0') {
            uVar5 = -(int)lVar16;
            break;
          }
          lVar16 = lVar16 + -1;
        } while (-lVar16 != (ulong)uVar5);
        uVar5 = uVar5 >> 4;
        local_34 = c;
      }
      uVar20 = uVar20 + (uVar5 / uVar3) * uVar3 * -0x10;
    }
    uVar5 = (uVar3 << sVar8) + uVar20;
    if (uVar3 << 0x14 < uVar5) {
      MBCSAddFromUnicode();
      return '\0';
    }
    if (uVar20 < uVar5) {
      uVar15 = uVar19;
      do {
        uVar6 = (ulong)uVar15;
        uVar15 = uVar15 + 1;
        mbcsData->stage2[uVar6] = (uVar20 >> 4) / uVar3;
        uVar20 = uVar20 + uVar3 * 0x10;
      } while (uVar20 < uVar5);
    }
    mbcsData->stage3Top = uVar5;
  }
  uVar15 = mbcsData->stage2[uVar19] << 4;
  uVar5 = uVar15 & 0xffff0;
  if ((cVar11 != '\0') && (c <= (int)(uint)mbcsData->utf8Max)) {
    if (uVar5 < 0x10000) {
      mbcsData->stageUTF8[c >> 6] = (uint16_t)uVar15;
    }
    else {
      mbcsData->utf8Max = 0xfeff;
    }
  }
  uVar15 = 0;
  pbVar12 = bytes;
  if (length != 2) {
    pbVar13 = bytes;
    if (length != 3) {
      if (length != 4) goto LAB_001dd554;
      pbVar13 = bytes + 1;
      uVar15 = (uint)*bytes << 8;
    }
    pbVar12 = pbVar13 + 1;
    uVar15 = (*pbVar13 | uVar15) << 8;
  }
  pbVar13 = pbVar12 + 1;
  uVar15 = (*pbVar12 | uVar15) << 8;
LAB_001dd554:
  bVar9 = *pbVar13;
  uVar17 = uVar15 | bVar9;
  uVar6 = (ulong)((uVar5 + uVar4) * uVar3);
  if (uVar3 == 4) {
    uVar5 = *(uint *)(local_40 + uVar6);
    *(uint *)(local_40 + uVar6) = uVar17;
  }
  else if (uVar3 == 3) {
    bVar2 = local_40[uVar6];
    local_40[uVar6] = (uint8_t)(uVar15 >> 0x10);
    bVar1 = local_40[uVar6 + 1];
    local_40[uVar6 + 1] = (uint8_t)(uVar15 >> 8);
    uVar5 = (uint)local_40[uVar6 + 2] | (uint)bVar1 << 8 | (uint)bVar2 << 0x10;
    local_40[uVar6 + 2] = bVar9;
  }
  else {
    uVar5 = 0;
    if (uVar3 == 2) {
      uVar5 = (uint)*(ushort *)(local_40 + uVar6);
      *(short *)(local_40 + uVar6) = (short)uVar17;
    }
  }
  bVar9 = (byte)c & 0xf | 0x10;
  uVar19 = (uVar4 >> 4) + uVar19;
  if (((mbcsData->stage2[uVar19] >> bVar9 & 1) != 0) || (uVar5 != 0)) {
    if (-1 < flag) {
      if (length < 1) {
        pcVar7 = local_4e;
      }
      else {
        iVar18 = length + 1;
        pcVar7 = local_4e;
        do {
          bVar9 = *bytes;
          cVar11 = '0';
          cVar14 = '0';
          if (0x9f < bVar9) {
            cVar14 = 'W';
          }
          *pcVar7 = cVar14 + (bVar9 >> 4);
          if (9 < (bVar9 & 0xf)) {
            cVar11 = 'W';
          }
          pcVar7[1] = cVar11 + (bVar9 & 0xf);
          pcVar7 = pcVar7 + 2;
          bytes = bytes + 1;
          iVar18 = iVar18 + -1;
        } while (1 < iVar18);
      }
      *pcVar7 = '\0';
      fprintf(_stderr,"error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
              (ulong)(uint)c,local_4e);
      return '\0';
    }
    if (VERBOSE != '\0') {
      if (length < 1) {
        pcVar7 = local_4e;
      }
      else {
        iVar18 = length + 1;
        pcVar7 = local_4e;
        do {
          bVar2 = *bytes;
          cVar11 = '0';
          cVar14 = '0';
          if (0x9f < bVar2) {
            cVar14 = 'W';
          }
          *pcVar7 = cVar14 + (bVar2 >> 4);
          if (9 < (bVar2 & 0xf)) {
            cVar11 = 'W';
          }
          pcVar7[1] = cVar11 + (bVar2 & 0xf);
          pcVar7 = pcVar7 + 2;
          bytes = bytes + 1;
          iVar18 = iVar18 + -1;
        } while (1 < iVar18);
      }
      *pcVar7 = '\0';
      fprintf(_stderr,"duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",(ulong)(uint)c,
              local_4e);
    }
  }
  if ((char)local_44 < '\x01') {
    mbcsData->stage2[uVar19] = mbcsData->stage2[uVar19] | (uint)(1L << bVar9);
  }
  return '\x01';
}

Assistant:

static UBool
MBCSAddFromUnicode(MBCSData *mbcsData,
                   const uint8_t *bytes, int32_t length,
                   UChar32 c,
                   int8_t flag) {
    char buffer[10];
    const uint8_t *pb;
    uint8_t *stage3, *p;
    uint32_t idx, b, old, stage3Index;
    int32_t maxCharLength;

    uint32_t blockSize, newTop, i, nextOffset, newBlock, min, overlap, maxOverlap;

    maxCharLength=mbcsData->ucm->states.maxCharLength;

    if( mbcsData->ucm->states.outputType==MBCS_OUTPUT_2_SISO &&
        (!IGNORE_SISO_CHECK && (*bytes==0xe || *bytes==0xf))
    ) {
        fprintf(stderr, "error: illegal mapping to SI or SO for SI/SO codepage: U+%04x<->0x%s\n",
            (int)c, printBytes(buffer, bytes, length));
        return FALSE;
    }

    if(flag==1 && length==1 && *bytes==0) {
        fprintf(stderr, "error: unable to encode a |1 fallback from U+%04x to 0x%02x\n",
            (int)c, *bytes);
        return FALSE;
    }

    /*
     * Walk down the triple-stage compact array ("trie") and
     * allocate parts as necessary.
     * Note that the first stage 2 and 3 blocks are reserved for
     * all-unassigned mappings.
     * We assume that length<=maxCharLength and that c<=0x10ffff.
     */
    stage3=mbcsData->fromUBytes;

    /* inspect stage 1 */
    idx=c>>MBCS_STAGE_1_SHIFT;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK&~(MBCS_UTF8_STAGE_3_BLOCKS-1);
    } else {
        nextOffset=(c>>MBCS_STAGE_2_SHIFT)&MBCS_STAGE_2_BLOCK_MASK;
    }
    if(mbcsData->stage1[idx]==MBCS_STAGE_2_ALL_UNASSIGNED_INDEX) {
        /* allocate another block in stage 2 */
        newBlock=mbcsData->stage2Top;
        if(mbcsData->utf8Friendly) {
            min=newBlock-nextOffset; /* minimum block start with overlap */
            while(min<newBlock && mbcsData->stage2[newBlock-1]==0) {
                --newBlock;
            }
        }
        newTop=newBlock+MBCS_STAGE_2_BLOCK_SIZE;

        if(newTop>MBCS_MAX_STAGE_2_TOP) {
            fprintf(stderr, "error: too many stage 2 entries at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }

        /*
         * each stage 2 block contains 64 32-bit words:
         * 6 code point bits 9..4 with value with bits 31..16 "assigned" flags and bits 15..0 stage 3 index
         */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage1[i++]=(uint16_t)newBlock;
            newBlock+=MBCS_STAGE_2_BLOCK_SIZE;
        }
        mbcsData->stage2Top=newTop; /* ==newBlock */
    }

    /* inspect stage 2 */
    idx=mbcsData->stage1[idx]+nextOffset;
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* allocate 64-entry blocks for UTF-8-friendly lookup */
        blockSize=MBCS_UTF8_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_UTF8_STAGE_3_BLOCK_MASK;
    } else {
        blockSize=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        nextOffset=c&MBCS_STAGE_3_BLOCK_MASK;
    }
    if(mbcsData->stage2[idx]==0) {
        /* allocate another block in stage 3 */
        newBlock=mbcsData->stage3Top;
        if(mbcsData->utf8Friendly && nextOffset>=MBCS_STAGE_3_GRANULARITY) {
            /*
             * Overlap stage 3 blocks only in multiples of 16-entry blocks
             * because of the indexing granularity in stage 2.
             */
            maxOverlap=(nextOffset&~(MBCS_STAGE_3_GRANULARITY-1))*maxCharLength;
            for(overlap=0;
                overlap<maxOverlap && stage3[newBlock-overlap-1]==0;
                ++overlap) {}

            overlap=(overlap/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            overlap=(overlap*MBCS_STAGE_3_GRANULARITY)*maxCharLength;

            newBlock-=overlap;
        }
        newTop=newBlock+blockSize;

        if(newTop>MBCS_STAGE_3_MBCS_SIZE*(uint32_t)maxCharLength) {
            fprintf(stderr, "error: too many code points at U+%04x<->0x%s\n",
                (int)c, printBytes(buffer, bytes, length));
            return FALSE;
        }
        /* each block has 16*maxCharLength bytes */
        i=idx;
        while(newBlock<newTop) {
            mbcsData->stage2[i++]=(newBlock/MBCS_STAGE_3_GRANULARITY)/maxCharLength;
            newBlock+=MBCS_STAGE_3_BLOCK_SIZE*maxCharLength;
        }
        mbcsData->stage3Top=newTop; /* ==newBlock */
    }

    stage3Index=MBCS_STAGE_3_GRANULARITY*(uint32_t)(uint16_t)mbcsData->stage2[idx];

    /* Build an alternate, UTF-8-friendly stage table as well. */
    if(mbcsData->utf8Friendly && c<=mbcsData->utf8Max) {
        /* Overflow for uint16_t entries in stageUTF8? */
        if(stage3Index>0xffff) {
            /*
             * This can occur only if the mapping table is nearly perfectly filled and if
             * utf8Max==0xffff.
             * (There is no known charset like this. GB 18030 does not map
             * surrogate code points and LMBCS does not map 256 PUA code points.)
             *
             * Otherwise, stage3Index<=MBCS_UTF8_LIMIT<0xffff
             * (stage3Index can at most reach exactly MBCS_UTF8_LIMIT)
             * because we have a sorted table and there are at most MBCS_UTF8_LIMIT
             * mappings with 0<=c<MBCS_UTF8_LIMIT, and there is only also
             * the initial all-unassigned block in stage3.
             *
             * Solution for the overflow: Reduce utf8Max to the next lower value, 0xfeff.
             *
             * (See svn revision 20866 of the markus/ucnvutf8 feature branch for
             * code that causes MBCSAddTable() to rebuild the table not utf8Friendly
             * in case of overflow. That code was not tested.)
             */
            mbcsData->utf8Max=0xfeff;
        } else {
            /*
             * The stage 3 block has been assigned for the regular trie.
             * Just copy its index into stageUTF8[], without the granularity.
             */
            mbcsData->stageUTF8[c>>MBCS_UTF8_STAGE_SHIFT]=(uint16_t)stage3Index;
        }
    }

    /* write the codepage bytes into stage 3 and get the previous bytes */

    /* assemble the bytes into a single integer */
    pb=bytes;
    b=0;
    switch(length) {
    case 4:
        b=*pb++;
        U_FALLTHROUGH;
    case 3:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 2:
        b=(b<<8)|*pb++;
        U_FALLTHROUGH;
    case 1:
    default:
        b=(b<<8)|*pb++;
        break;
    }

    old=0;
    p=stage3+(stage3Index+nextOffset)*maxCharLength;
    switch(maxCharLength) {
    case 2:
        old=*(uint16_t *)p;
        *(uint16_t *)p=(uint16_t)b;
        break;
    case 3:
        old=(uint32_t)*p<<16;
        *p++=(uint8_t)(b>>16);
        old|=(uint32_t)*p<<8;
        *p++=(uint8_t)(b>>8);
        old|=*p;
        *p=(uint8_t)b;
        break;
    case 4:
        old=*(uint32_t *)p;
        *(uint32_t *)p=b;
        break;
    default:
        /* will never occur */
        break;
    }

    /* check that this Unicode code point was still unassigned */
    if((mbcsData->stage2[idx+(nextOffset>>MBCS_STAGE_2_SHIFT)]&(1UL<<(16+(c&0xf))))!=0 || old!=0) {
        if(flag>=0) {
            fprintf(stderr, "error: duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
            return FALSE;
        } else if(VERBOSE) {
            fprintf(stderr, "duplicate Unicode code point at U+%04x<->0x%s see 0x%02x\n",
                (int)c, printBytes(buffer, bytes, length), (int)old);
        }
        /* continue after the above warning if the precision of the mapping is
           unspecified */
    }
    if(flag<=0) {
        /* set the roundtrip flag */
        mbcsData->stage2[idx+(nextOffset>>4)]|=(1UL<<(16+(c&0xf)));
    }

    return TRUE;
}